

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void nn_pipebase_getopt(nn_pipebase *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  uint errnum;
  FILE *__stream;
  undefined8 uVar3;
  int intval;
  
  if (level == 0) {
    if (option == 0xe) {
      intval = (self->options).ipv4only;
    }
    else if (option == 9) {
      intval = (self->options).rcvprio;
    }
    else {
      if (option != 8) {
        iVar1 = nn_sock_getopt_inner(self->sock,0,option,optval,optvallen);
        __stream = _stderr;
        if (iVar1 == 0) {
          return;
        }
        errnum = -iVar1;
        pcVar2 = nn_err_strerror(errnum);
        uVar3 = 0x96;
        goto LAB_00111d5b;
      }
      intval = (self->options).sndprio;
    }
    __n = 4;
    if (*optvallen < 4) {
      __n = *optvallen;
    }
    memcpy(optval,&intval,__n);
    *optvallen = 4;
  }
  else {
    iVar1 = nn_sock_getopt_inner(self->sock,level,option,optval,optvallen);
    __stream = _stderr;
    if (iVar1 != 0) {
      errnum = -iVar1;
      pcVar2 = nn_err_strerror(errnum);
      uVar3 = 0xa2;
LAB_00111d5b:
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)errnum,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/pipe.c"
              ,uVar3);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_pipebase_getopt (struct nn_pipebase *self, int level, int option,
    void *optval, size_t *optvallen)
{
    int rc;
    int intval;

    if (level == NN_SOL_SOCKET) {
        switch (option) {

        /*  Endpoint options  */
        case NN_SNDPRIO:
            intval = self->options.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->options.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->options.ipv4only;
            break;

        /*  Fallback to socket options  */
        default:
            rc = nn_sock_getopt_inner (self->sock, level,
                option, optval, optvallen);
            errnum_assert (rc == 0, -rc);
            return;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return;
    }

    rc = nn_sock_getopt_inner (self->sock, level, option, optval, optvallen);
    errnum_assert (rc == 0, -rc);
}